

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<false> * __thiscall
LabelState<false>::String
          (LabelState<false> *this,Context<false> *ctx,char *str,SizeType param_3,bool copy)

{
  vw *all;
  example *ec;
  allocator local_41;
  string local_40;
  
  all = ctx->all;
  ec = ctx->ex;
  std::__cxx11::string::string((string *)&local_40,str,&local_41);
  VW::parse_example_label(all,ec,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return ctx->previous_state;
}

Assistant:

BaseState<audit>* String(Context<audit>& ctx, const char* str, rapidjson::SizeType /* len */, bool copy)
  {
    // only to be used with copy=false
    assert(!copy);

    VW::parse_example_label(*ctx.all, *ctx.ex, str);
    return ctx.previous_state;
  }